

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_unittest.cc
# Opt level: O2

void __thiscall Test_Demangle_FromFile::Test_Demangle_FromFile(Test_Demangle_FromFile *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  ___std__vector<void(*)(),std::allocator<void(*)()>>__emplace_back<void(*)()>_void_________
            (&google::g_testlist,&local_8);
  return;
}

Assistant:

TEST(Demangle, FromFile) {
  string test_file = FLAGS_test_srcdir + "/src/demangle_unittest.txt";
  ifstream f(test_file.c_str());  // The file should exist.
  EXPECT_FALSE(f.fail());

  string line;
  while (getline(f, line)) {
    // Lines start with '#' are considered as comments.
    if (line.empty() || line[0] == '#') {
      continue;
    }
    // Each line should contain a mangled name and a demangled name
    // separated by '\t'.  Example: "_Z3foo\tfoo"
    string::size_type tab_pos = line.find('\t');
    EXPECT_NE(string::npos, tab_pos);
    string mangled = line.substr(0, tab_pos);
    string demangled = line.substr(tab_pos + 1);
    EXPECT_EQ(demangled, DemangleIt(mangled.c_str()));
  }
}